

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AZHighLevelEncoder.cpp
# Opt level: O2

EncodingState *
ZXing::Aztec::ShiftAndAppend
          (EncodingState *__return_storage_ptr__,EncodingState *state,int mode,int value)

{
  uint uVar1;
  vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_> tokens;
  Token local_4c;
  _Vector_base<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_> local_48;
  
  uVar1 = state->mode == 2 ^ 5;
  std::vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>::vector
            ((vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_> *)&local_48,
             &state->tokens);
  local_4c = (Token)(((int)*(char *)((long)mode + (long)state->mode * 6 + SHIFT_TABLE) & 0xffffU) +
                    uVar1 * -0x10000);
  std::vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>::
  emplace_back<ZXing::Aztec::Token>
            ((vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_> *)&local_48,
             &local_4c);
  local_4c = (Token)(value & 0xffffU | 0xfffb0000);
  std::vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>::
  emplace_back<ZXing::Aztec::Token>
            ((vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_> *)&local_48,
             &local_4c);
  std::vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>::vector
            (&__return_storage_ptr__->tokens,
             (vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_> *)&local_48);
  __return_storage_ptr__->mode = state->mode;
  __return_storage_ptr__->binaryShiftByteCount = 0;
  __return_storage_ptr__->bitCount = state->bitCount + uVar1 + 5;
  std::_Vector_base<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>::~_Vector_base
            (&local_48);
  return __return_storage_ptr__;
}

Assistant:

static EncodingState ShiftAndAppend(const EncodingState& state, int mode, int value)
{
	//assert binaryShiftByteCount == 0 && this.mode != mode;
	int thisModeBitCount = state.mode == MODE_DIGIT ? 4 : 5;
	// Shifts exist only to UPPER and PUNCT, both with tokens size 5.
	auto tokens = state.tokens;
	tokens.push_back(Token::CreateSimple(SHIFT_TABLE[state.mode][mode], thisModeBitCount));
	tokens.push_back(Token::CreateSimple(value, 5));
	return EncodingState{ tokens, state.mode, 0, state.bitCount + thisModeBitCount + 5 };
}